

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> * __thiscall
cmDebugger_impl::GetWatchpoints
          (vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *__return_storage_ptr__,
          cmDebugger_impl *this)

{
  bool bVar1;
  size_type __n;
  element_type *__x;
  undefined1 local_68 [8];
  shared_ptr<cmDebugger_impl::Watchpoint> watch;
  pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_> *watchWeak;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
  *__range1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  cmDebugger_impl *this_local;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *rtn;
  
  l._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->breakpointMutex);
  std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::vector(__return_storage_ptr__);
  __n = std::
        map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
        ::size(&this->activeWatchpoints);
  std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::reserve(__return_storage_ptr__,__n);
  __end1 = std::
           map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
           ::begin(&this->activeWatchpoints);
  watchWeak = (pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_> *)
              std::
              map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
              ::end(&this->activeWatchpoints);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&watchWeak), bVar1) {
    watch.super___shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>
            ::operator*(&__end1);
    std::weak_ptr<cmDebugger_impl::Watchpoint>::lock
              ((weak_ptr<cmDebugger_impl::Watchpoint> *)local_68);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
    if (bVar1) {
      __x = std::
            __shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
      std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::push_back
                (__return_storage_ptr__,&__x->super_cmWatchpoint);
    }
    std::shared_ptr<cmDebugger_impl::Watchpoint>::~shared_ptr
              ((shared_ptr<cmDebugger_impl::Watchpoint> *)local_68);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>
    ::operator++(&__end1);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmWatchpoint> GetWatchpoints() const override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    std::vector<cmWatchpoint> rtn;
    rtn.reserve(activeWatchpoints.size());
    for (auto& watchWeak : activeWatchpoints) {
      if (auto watch = watchWeak.second.lock()) {
        rtn.push_back(*watch);
      }
    }
    return rtn;
  }